

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBTooSmallStrideTest *this,GLuint test_case_index)

{
  pointer ptVar1;
  GLchar *__s;
  size_t sVar2;
  ulong uVar3;
  TestError *this_00;
  stringstream stream;
  stringstream asStack_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBTooSmallStrideTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Stage: ",7);
  __s = Utils::Shader::GetStageName(ptVar1[test_case_index].m_stage);
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", case: ",8);
  uVar3 = (ulong)ptVar1[test_case_index].m_case;
  if (uVar3 < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,&DAT_01a08dc8 + *(int *)(&DAT_01a08dc8 + uVar3 * 4),
               *(long *)(&DAT_01a1a760 + uVar3 * 8));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(asStack_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0x5157);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string XFBTooSmallStrideTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage) << ", case: ";

	switch (test_case.m_case)
	{
	case OFFSET:
		stream << "buffer stride: 40, vec4 offset: 32";
		break;
	case STRIDE:
		stream << "buffer stride: 32, vec4 off 16 stride: 32";
		break;
	case BLOCK:
		stream << "buffer stride: 32, block 3xvec4 offset 0";
		break;
	case ARRAY:
		stream << "buffer stride: 32, vec4[4] offset 16";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return stream.str();
}